

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void utf8_suite::test_FC_80_80_80_80(void)

{
  view_type *pvVar1;
  undefined4 local_14c;
  value local_148 [2];
  undefined1 local_140 [8];
  decoder_type decoder;
  char input [8];
  
  decoder.current.scan.string.segment_tail[0x1f] = (const_pointer)0x2280808080fc22;
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<8ul>
            ((basic_decoder<char> *)local_140,
             (value_type (*) [8])(decoder.current.scan.string.segment_tail + 0x1f));
  local_148[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_140);
  local_14c = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x888,"void utf8_suite::test_FC_80_80_80_80()",local_148,&local_14c);
  pvVar1 = trial::protocol::json::detail::basic_decoder<char>::literal
                     ((basic_decoder<char> *)local_140);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[7]>
            ("decoder.literal()","\"\\\"\\xFC\\x80\\x80\\x80\\x80\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x889,"void utf8_suite::test_FC_80_80_80_80()",pvVar1,anon_var_dwarf_7012);
  return;
}

Assistant:

void test_FC_80_80_80_80()
{
    const char input[] = "\"\xFC\x80\x80\x80\x80\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_unexpected_token);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal(), "\"\xFC\x80\x80\x80\x80");
}